

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

void helper_fxam_ST0_x86_64(CPUX86State *env)

{
  uint64_t uVar1;
  ulong uVar2;
  int expdif;
  CPU_LDoubleU temp;
  CPUX86State *env_local;
  
  uVar1 = env->fpregs[env->fpstt].d.low;
  uVar2 = *(ulong *)((long)(env->fpregs + env->fpstt) + 8);
  env->fpus = env->fpus & 0xb8ff;
  temp.d.low._0_2_ = (undefined2)uVar2;
  if ((uVar2 & 0x8000) != 0) {
    env->fpus = env->fpus | 0x200;
  }
  if (env->fptags[env->fpstt] == '\0') {
    if ((temp.d.low._0_2_ & 0x7fff) == 0x7fff) {
      if (uVar1 == 0x8000000000000000) {
        env->fpus = env->fpus | 0x500;
      }
      else {
        env->fpus = env->fpus | 0x100;
      }
    }
    else if ((uVar2 & 0x7fff) == 0) {
      if (uVar1 == 0) {
        env->fpus = env->fpus | 0x4000;
      }
      else {
        env->fpus = env->fpus | 0x4400;
      }
    }
    else {
      env->fpus = env->fpus | 0x400;
    }
  }
  else {
    env->fpus = env->fpus | 0x4100;
  }
  return;
}

Assistant:

void helper_fxam_ST0(CPUX86State *env)
{
    CPU_LDoubleU temp;
    int expdif;

    temp.d = ST0;

    env->fpus &= ~0x4700; /* (C3,C2,C1,C0) <-- 0000 */
    if (SIGND(temp)) {
        env->fpus |= 0x200; /* C1 <-- 1 */
    }

    if (env->fptags[env->fpstt]) {
        env->fpus |= 0x4100; /* Empty */
        return;
    }

    expdif = EXPD(temp);
    if (expdif == MAXEXPD) {
        if (MANTD(temp) == 0x8000000000000000ULL) {
            env->fpus |= 0x500; /* Infinity */
        } else {
            env->fpus |= 0x100; /* NaN */
        }
    } else if (expdif == 0) {
        if (MANTD(temp) == 0) {
            env->fpus |=  0x4000; /* Zero */
        } else {
            env->fpus |= 0x4400; /* Denormal */
        }
    } else {
        env->fpus |= 0x400;
    }
}